

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O1

void __thiscall mjs::value::value(value *this,reference *r)

{
  gc_heap *pgVar1;
  
  this->type_ = reference;
  pgVar1 = (r->base_).super_gc_heap_ptr_untyped.heap_;
  (this->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = pgVar1;
  *(uint32_t *)((long)&this->field_1 + 8) = (r->base_).super_gc_heap_ptr_untyped.pos_;
  if (pgVar1 != (gc_heap *)0x0) {
    gc_heap::attach(pgVar1,(gc_heap_ptr_untyped *)&(this->field_1).s_);
  }
  pgVar1 = (r->property_name_).super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
  (this->field_1).r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
  heap_ = pgVar1;
  *(uint32_t *)((long)&this->field_1 + 0x18) =
       (r->property_name_).super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  if (pgVar1 != (gc_heap *)0x0) {
    gc_heap::attach(pgVar1,(gc_heap_ptr_untyped *)&(this->field_1).r_.property_name_);
  }
  return;
}

Assistant:

explicit value(const reference& r) : type_(value_type::reference), r_(r) {}